

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed.c
# Opt level: O0

void scale16(pced *out,int pow,int x)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int k;
  int i;
  int absx;
  int sgnx;
  int neg;
  limb_t mask;
  limb_t mB;
  limb_t mA;
  pced R;
  int local_b4;
  int local_b0;
  uint local_ac;
  ulong local_88 [5];
  ulong auStack_60 [5];
  ulong auStack_38 [5];
  int local_10;
  int local_c;
  long local_8;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_88,0,0x78);
  uVar1 = local_10 >> 3 & 1;
  iVar2 = uVar1 * -2 + 1;
  local_ac = iVar2 * local_10;
  local_c = local_c >> 1;
  uVar3 = (ulong)(int)(local_ac | (int)local_ac >> 2);
  uVar3 = (((long)uVar3 >> 1 | uVar3) & 1) - 1;
  for (local_b0 = 0; local_b0 < 5; local_b0 = local_b0 + 1) {
    local_88[local_b0] = pced_zero.diff[local_b0] & uVar3 ^ local_88[local_b0];
    auStack_60[local_b0] = pced_zero.sum[local_b0] & uVar3 ^ auStack_60[local_b0];
    auStack_38[local_b0] = pced_zero.prod[local_b0] & uVar3 ^ auStack_38[local_b0];
  }
  for (local_b4 = 0; local_b4 < 8; local_b4 = local_b4 + 1) {
    local_ac = local_ac - 1;
    uVar3 = (ulong)(int)(local_ac | (int)local_ac >> 2);
    uVar3 = (((long)uVar3 >> 1 | uVar3) & 1) - 1;
    for (local_b0 = 0; local_b0 < 5; local_b0 = local_b0 + 1) {
      local_88[local_b0] = ed_lookup[local_c][local_b4].diff[local_b0] & uVar3 ^ local_88[local_b0];
      auStack_60[local_b0] =
           *(ulong *)((long)local_c * 0x3c0 + (long)local_b4 * 0x78 + 0x1093b8 + (long)local_b0 * 8)
           & uVar3 ^ auStack_60[local_b0];
      auStack_38[local_b0] =
           *(ulong *)((long)local_c * 0x3c0 + (long)local_b4 * 0x78 + 0x1093e0 + (long)local_b0 * 8)
           & uVar3 ^ auStack_38[local_b0];
    }
  }
  uVar3 = (ulong)(int)(uVar1 - 1);
  for (local_b0 = 0; local_b0 < 5; local_b0 = local_b0 + 1) {
    *(ulong *)(local_8 + (long)local_b0 * 8) =
         uVar3 & local_88[local_b0] ^ (uVar3 ^ 0xffffffffffffffff) & auStack_60[local_b0];
    *(ulong *)(local_8 + 0x28 + (long)local_b0 * 8) =
         (uVar3 ^ 0xffffffffffffffff) & local_88[local_b0] ^ uVar3 & auStack_60[local_b0];
    *(ulong *)(local_8 + 0x50 + (long)local_b0 * 8) = (long)iVar2 * auStack_38[local_b0];
  }
  return;
}

Assistant:

static void
scale16(struct pced *out, int pow, int x)
{
	struct pced R = { { 0 }, { 0 }, { 0 } };
	limb_t mA, mB, mask;
	int neg, sgnx, absx;
	int i, k;
	
	neg = (x >> 3) & 1;
	sgnx = 1 - 2*neg;
	absx = sgnx * x;
	pow >>= 1;

	/* handle abs(x) == 0 */
	mask = absx | (absx >> 2);
	mask |= mask >> 1;
	mask = (mask & 1) - 1;
	for (i = 0; i < FLD_LIMB_NUM; i++) {
		R.diff[i] ^= pced_zero.diff[i] & mask;
		R.sum[i] ^= pced_zero.sum[i] & mask;
		R.prod[i] ^= pced_zero.prod[i] & mask;
	}


	/* go through our table and look for abs(x) */
	for (k = 0; k < 8; k++) {
		absx--;
		mask = absx | (absx >> 2);
		mask |= mask >> 1;
		mask = (mask & 1) - 1;
		for (i = 0; i < FLD_LIMB_NUM; i++) {
			R.diff[i] ^= ed_lookup[pow][k].diff[i] & mask;
			R.sum[i] ^= ed_lookup[pow][k].sum[i] & mask;
			R.prod[i] ^= ed_lookup[pow][k].prod[i] & mask;
		}
	}

	/* conditionally negate R and write to out */
	mA = neg-1;
	mB = ~mA;
	for (i = 0; i < FLD_LIMB_NUM; i++) {
		out->diff[i] = (mA & R.diff[i]) ^ (mB & R.sum[i]);
		out->sum[i]  = (mB & R.diff[i]) ^ (mA & R.sum[i]);
		out->prod[i] = sgnx * R.prod[i];
	}
}